

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct32_stage9_sse4_1
               (__m128i *bf1,__m128i *out,int do_cols,int bd,int out_shift,__m128i *clamp_lo,
               __m128i *clamp_hi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  __m128i *palVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  __m128i rnding;
  int iVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  __m128i clamp_lo_out;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  iVar22 = (int)(*bf1)[0];
  iVar24 = *(int *)((long)*bf1 + 4);
  iVar26 = (int)(*bf1)[1];
  iVar28 = *(int *)((long)*bf1 + 0xc);
  iVar10 = (int)bf1[0x1f][0];
  iVar1 = *(int *)((long)bf1[0x1f] + 4);
  iVar11 = (int)bf1[0x1f][1];
  iVar2 = *(int *)((long)bf1[0x1f] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)*out = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)*out + 4) = (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(*out + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x1f] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x1f] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x1f] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x1f] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[1][0];
  iVar24 = *(int *)((long)bf1[1] + 4);
  iVar26 = (int)bf1[1][1];
  iVar28 = *(int *)((long)bf1[1] + 0xc);
  iVar10 = (int)bf1[0x1e][0];
  iVar1 = *(int *)((long)bf1[0x1e] + 4);
  iVar11 = (int)bf1[0x1e][1];
  iVar2 = *(int *)((long)bf1[0x1e] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[1] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[1] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x1e] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x1e] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x1e] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x1e] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[2][0];
  iVar24 = *(int *)((long)bf1[2] + 4);
  iVar26 = (int)bf1[2][1];
  iVar28 = *(int *)((long)bf1[2] + 0xc);
  iVar10 = (int)bf1[0x1d][0];
  iVar1 = *(int *)((long)bf1[0x1d] + 4);
  iVar11 = (int)bf1[0x1d][1];
  iVar2 = *(int *)((long)bf1[0x1d] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[2] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[2] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x1d] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x1d] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x1d] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x1d] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[3][0];
  iVar24 = *(int *)((long)bf1[3] + 4);
  iVar26 = (int)bf1[3][1];
  iVar28 = *(int *)((long)bf1[3] + 0xc);
  iVar10 = (int)bf1[0x1c][0];
  iVar1 = *(int *)((long)bf1[0x1c] + 4);
  iVar11 = (int)bf1[0x1c][1];
  iVar2 = *(int *)((long)bf1[0x1c] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[3] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[3] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x1c] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x1c] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x1c] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x1c] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[4][0];
  iVar24 = *(int *)((long)bf1[4] + 4);
  iVar26 = (int)bf1[4][1];
  iVar28 = *(int *)((long)bf1[4] + 0xc);
  iVar10 = (int)bf1[0x1b][0];
  iVar1 = *(int *)((long)bf1[0x1b] + 4);
  iVar11 = (int)bf1[0x1b][1];
  iVar2 = *(int *)((long)bf1[0x1b] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[4] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[4] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x1b] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x1b] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x1b] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x1b] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[5][0];
  iVar24 = *(int *)((long)bf1[5] + 4);
  iVar26 = (int)bf1[5][1];
  iVar28 = *(int *)((long)bf1[5] + 0xc);
  iVar10 = (int)bf1[0x1a][0];
  iVar1 = *(int *)((long)bf1[0x1a] + 4);
  iVar11 = (int)bf1[0x1a][1];
  iVar2 = *(int *)((long)bf1[0x1a] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[5] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[5] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x1a] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x1a] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x1a] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x1a] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[6][0];
  iVar24 = *(int *)((long)bf1[6] + 4);
  iVar26 = (int)bf1[6][1];
  iVar28 = *(int *)((long)bf1[6] + 0xc);
  iVar10 = (int)bf1[0x19][0];
  iVar1 = *(int *)((long)bf1[0x19] + 4);
  iVar11 = (int)bf1[0x19][1];
  iVar2 = *(int *)((long)bf1[0x19] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[6] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[6] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x19] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x19] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x19] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x19] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[7][0];
  iVar24 = *(int *)((long)bf1[7] + 4);
  iVar26 = (int)bf1[7][1];
  iVar28 = *(int *)((long)bf1[7] + 0xc);
  iVar10 = (int)bf1[0x18][0];
  iVar1 = *(int *)((long)bf1[0x18] + 4);
  iVar11 = (int)bf1[0x18][1];
  iVar2 = *(int *)((long)bf1[0x18] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[7] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[7] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x18] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x18] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x18] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x18] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[8][0];
  iVar24 = *(int *)((long)bf1[8] + 4);
  iVar26 = (int)bf1[8][1];
  iVar28 = *(int *)((long)bf1[8] + 0xc);
  iVar10 = (int)bf1[0x17][0];
  iVar1 = *(int *)((long)bf1[0x17] + 4);
  iVar11 = (int)bf1[0x17][1];
  iVar2 = *(int *)((long)bf1[0x17] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[8] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[8] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x17] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x17] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x17] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x17] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[9][0];
  iVar24 = *(int *)((long)bf1[9] + 4);
  iVar26 = (int)bf1[9][1];
  iVar28 = *(int *)((long)bf1[9] + 0xc);
  iVar10 = (int)bf1[0x16][0];
  iVar1 = *(int *)((long)bf1[0x16] + 4);
  iVar11 = (int)bf1[0x16][1];
  iVar2 = *(int *)((long)bf1[0x16] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[9] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[9] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x16] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x16] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x16] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x16] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[10][0];
  iVar24 = *(int *)((long)bf1[10] + 4);
  iVar26 = (int)bf1[10][1];
  iVar28 = *(int *)((long)bf1[10] + 0xc);
  iVar10 = (int)bf1[0x15][0];
  iVar1 = *(int *)((long)bf1[0x15] + 4);
  iVar11 = (int)bf1[0x15][1];
  iVar2 = *(int *)((long)bf1[0x15] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[10] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[10] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x15] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x15] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x15] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x15] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[0xb][0];
  iVar24 = *(int *)((long)bf1[0xb] + 4);
  iVar26 = (int)bf1[0xb][1];
  iVar28 = *(int *)((long)bf1[0xb] + 0xc);
  iVar10 = (int)bf1[0x14][0];
  iVar1 = *(int *)((long)bf1[0x14] + 4);
  iVar11 = (int)bf1[0x14][1];
  iVar2 = *(int *)((long)bf1[0x14] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[0xb] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[0xb] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x14] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x14] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x14] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x14] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[0xc][0];
  iVar24 = *(int *)((long)bf1[0xc] + 4);
  iVar26 = (int)bf1[0xc][1];
  iVar28 = *(int *)((long)bf1[0xc] + 0xc);
  iVar10 = (int)bf1[0x13][0];
  iVar1 = *(int *)((long)bf1[0x13] + 4);
  iVar11 = (int)bf1[0x13][1];
  iVar2 = *(int *)((long)bf1[0x13] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[0xc] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[0xc] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x13] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x13] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x13] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x13] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[0xd][0];
  iVar24 = *(int *)((long)bf1[0xd] + 4);
  iVar26 = (int)bf1[0xd][1];
  iVar28 = *(int *)((long)bf1[0xd] + 0xc);
  iVar10 = (int)bf1[0x12][0];
  iVar1 = *(int *)((long)bf1[0x12] + 4);
  iVar11 = (int)bf1[0x12][1];
  iVar2 = *(int *)((long)bf1[0x12] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[0xd] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[0xd] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x12] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x12] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x12] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x12] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[0xe][0];
  iVar24 = *(int *)((long)bf1[0xe] + 4);
  iVar26 = (int)bf1[0xe][1];
  iVar28 = *(int *)((long)bf1[0xe] + 0xc);
  iVar10 = (int)bf1[0x11][0];
  iVar1 = *(int *)((long)bf1[0x11] + 4);
  iVar11 = (int)bf1[0x11][1];
  iVar2 = *(int *)((long)bf1[0x11] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[0xe] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[0xe] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x11] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x11] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x11] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x11] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  iVar22 = (int)bf1[0xf][0];
  iVar24 = *(int *)((long)bf1[0xf] + 4);
  iVar26 = (int)bf1[0xf][1];
  iVar28 = *(int *)((long)bf1[0xf] + 0xc);
  iVar10 = (int)bf1[0x10][0];
  iVar1 = *(int *)((long)bf1[0x10] + 4);
  iVar11 = (int)bf1[0x10][1];
  iVar2 = *(int *)((long)bf1[0x10] + 0xc);
  iVar12 = (int)(*clamp_lo)[0];
  iVar3 = *(int *)((long)*clamp_lo + 4);
  iVar4 = (int)(*clamp_lo)[1];
  iVar5 = *(int *)((long)*clamp_lo + 0xc);
  iVar6 = (int)(*clamp_hi)[0];
  iVar7 = *(int *)((long)*clamp_hi + 4);
  iVar8 = (int)(*clamp_hi)[1];
  iVar9 = *(int *)((long)*clamp_hi + 0xc);
  iVar31 = iVar10 + iVar22;
  iVar33 = iVar1 + iVar24;
  iVar35 = iVar11 + iVar26;
  iVar37 = iVar2 + iVar28;
  iVar22 = iVar22 - iVar10;
  iVar24 = iVar24 - iVar1;
  iVar26 = iVar26 - iVar11;
  iVar28 = iVar28 - iVar2;
  uVar32 = (uint)(iVar31 < iVar12) * iVar12 | (uint)(iVar31 >= iVar12) * iVar31;
  uVar34 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar36 = (uint)(iVar35 < iVar4) * iVar4 | (uint)(iVar35 >= iVar4) * iVar35;
  uVar38 = (uint)(iVar37 < iVar5) * iVar5 | (uint)(iVar37 >= iVar5) * iVar37;
  uVar23 = (uint)(iVar22 < iVar12) * iVar12 | (uint)(iVar22 >= iVar12) * iVar22;
  uVar25 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar27 = (uint)(iVar26 < iVar4) * iVar4 | (uint)(iVar26 >= iVar4) * iVar26;
  uVar29 = (uint)(iVar28 < iVar5) * iVar5 | (uint)(iVar28 >= iVar5) * iVar28;
  *(uint *)out[0xf] = (uint)(iVar6 < (int)uVar32) * iVar6 | (iVar6 >= (int)uVar32) * uVar32;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
  *(uint *)(out[0xf] + 1) = (uint)(iVar8 < (int)uVar36) * iVar8 | (iVar8 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar9 < (int)uVar38) * iVar9 | (iVar9 >= (int)uVar38) * uVar38;
  *(uint *)out[0x10] = (uint)(iVar6 < (int)uVar23) * iVar6 | (iVar6 >= (int)uVar23) * uVar23;
  *(uint *)((long)out[0x10] + 4) =
       (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
  *(uint *)(out[0x10] + 1) = (uint)(iVar8 < (int)uVar27) * iVar8 | (iVar8 >= (int)uVar27) * uVar27;
  *(uint *)((long)out[0x10] + 0xc) =
       (uint)(iVar9 < (int)uVar29) * iVar9 | (iVar9 >= (int)uVar29) * uVar29;
  if (do_cols == 0) {
    iVar22 = 10;
    if (10 < bd) {
      iVar22 = bd;
    }
    local_28 = 0x20 << ((byte)iVar22 & 0x1f);
    local_18 = -local_28;
    local_28 = local_28 + -1;
    iVar22 = 1 << ((char)out_shift - 1U & 0x1f);
    palVar20 = out + 7;
    uVar21 = 0xfffffffffffffff8;
    do {
      if (out_shift != 0) {
        iVar24 = *(int *)((long)palVar20[-7] + 4);
        lVar13 = palVar20[-7][1];
        iVar26 = *(int *)((long)palVar20[-7] + 0xc);
        lVar14 = palVar20[-6][0];
        iVar28 = *(int *)((long)palVar20[-6] + 4);
        lVar15 = palVar20[-6][1];
        iVar10 = *(int *)((long)palVar20[-6] + 0xc);
        lVar16 = palVar20[-5][0];
        iVar1 = *(int *)((long)palVar20[-5] + 4);
        lVar17 = palVar20[-5][1];
        iVar11 = *(int *)((long)palVar20[-5] + 0xc);
        lVar18 = palVar20[-4][0];
        iVar2 = *(int *)((long)palVar20[-4] + 4);
        lVar19 = palVar20[-4][1];
        iVar12 = *(int *)((long)palVar20[-4] + 0xc);
        auVar30 = ZEXT416((uint)out_shift);
        *(int *)palVar20[-7] = (int)palVar20[-7][0] + iVar22 >> auVar30;
        *(int *)((long)palVar20[-7] + 4) = iVar24 + iVar22 >> auVar30;
        *(int *)(palVar20[-7] + 1) = (int)lVar13 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-7] + 0xc) = iVar26 + iVar22 >> auVar30;
        *(int *)palVar20[-6] = (int)lVar14 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-6] + 4) = iVar28 + iVar22 >> auVar30;
        *(int *)(palVar20[-6] + 1) = (int)lVar15 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-6] + 0xc) = iVar10 + iVar22 >> auVar30;
        *(int *)palVar20[-5] = (int)lVar16 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-5] + 4) = iVar1 + iVar22 >> auVar30;
        *(int *)(palVar20[-5] + 1) = (int)lVar17 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-5] + 0xc) = iVar11 + iVar22 >> auVar30;
        *(int *)palVar20[-4] = (int)lVar18 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-4] + 4) = iVar2 + iVar22 >> auVar30;
        *(int *)(palVar20[-4] + 1) = (int)lVar19 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-4] + 0xc) = iVar12 + iVar22 >> auVar30;
        iVar24 = *(int *)((long)palVar20[-3] + 4);
        lVar13 = palVar20[-3][1];
        iVar26 = *(int *)((long)palVar20[-3] + 0xc);
        lVar14 = palVar20[-2][0];
        iVar28 = *(int *)((long)palVar20[-2] + 4);
        lVar15 = palVar20[-2][1];
        iVar10 = *(int *)((long)palVar20[-2] + 0xc);
        lVar16 = palVar20[-1][0];
        iVar1 = *(int *)((long)palVar20[-1] + 4);
        lVar17 = palVar20[-1][1];
        iVar11 = *(int *)((long)palVar20[-1] + 0xc);
        lVar18 = (*palVar20)[0];
        iVar2 = *(int *)((long)*palVar20 + 4);
        lVar19 = (*palVar20)[1];
        iVar12 = *(int *)((long)*palVar20 + 0xc);
        *(int *)palVar20[-3] = (int)palVar20[-3][0] + iVar22 >> auVar30;
        *(int *)((long)palVar20[-3] + 4) = iVar24 + iVar22 >> auVar30;
        *(int *)(palVar20[-3] + 1) = (int)lVar13 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-3] + 0xc) = iVar26 + iVar22 >> auVar30;
        *(int *)palVar20[-2] = (int)lVar14 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-2] + 4) = iVar28 + iVar22 >> auVar30;
        *(int *)(palVar20[-2] + 1) = (int)lVar15 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-2] + 0xc) = iVar10 + iVar22 >> auVar30;
        *(int *)palVar20[-1] = (int)lVar16 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-1] + 4) = iVar1 + iVar22 >> auVar30;
        *(int *)(palVar20[-1] + 1) = (int)lVar17 + iVar22 >> auVar30;
        *(int *)((long)palVar20[-1] + 0xc) = iVar11 + iVar22 >> auVar30;
        *(int *)*palVar20 = (int)lVar18 + iVar22 >> auVar30;
        *(int *)((long)*palVar20 + 4) = iVar2 + iVar22 >> auVar30;
        *(int *)(*palVar20 + 1) = (int)lVar19 + iVar22 >> auVar30;
        *(int *)((long)*palVar20 + 0xc) = iVar12 + iVar22 >> auVar30;
      }
      uVar21 = uVar21 + 8;
      palVar20 = palVar20 + 8;
    } while (uVar21 < 0x18);
    iStack_24 = local_28;
    iStack_20 = local_28;
    iStack_1c = local_28;
    iStack_14 = local_18;
    iStack_10 = local_18;
    iStack_c = local_18;
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,0x20);
  }
  return;
}

Assistant:

static inline void idct32_stage9_sse4_1(__m128i *bf1, __m128i *out,
                                        const int do_cols, const int bd,
                                        const int out_shift,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi) {
  addsub_sse4_1(bf1[0], bf1[31], out + 0, out + 31, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[30], out + 1, out + 30, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[29], out + 2, out + 29, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[28], out + 3, out + 28, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[4], bf1[27], out + 4, out + 27, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[5], bf1[26], out + 5, out + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[6], bf1[25], out + 6, out + 25, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[7], bf1[24], out + 7, out + 24, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[8], bf1[23], out + 8, out + 23, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[9], bf1[22], out + 9, out + 22, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[10], bf1[21], out + 10, out + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[11], bf1[20], out + 11, out + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[12], bf1[19], out + 12, out + 19, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[13], bf1[18], out + 13, out + 18, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[14], bf1[17], out + 14, out + 17, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[15], bf1[16], out + 15, out + 16, clamp_lo, clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    for (int i = 0; i < 32; i += 8) {
      round_shift_4x4(out + i, out_shift);
      round_shift_4x4(out + i + 4, out_shift);
    }
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}